

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

int64_t hdr_add(hdr_histogram *h,hdr_histogram *from)

{
  int64_t iVar1;
  _Bool _Var2;
  int64_t count;
  int64_t value;
  int64_t dropped;
  hdr_iter iter;
  hdr_histogram *from_local;
  hdr_histogram *h_local;
  
  value = 0;
  iter._next_fp = (_func__Bool_hdr_iter_ptr *)from;
  hdr_iter_recorded_init((hdr_iter *)&dropped,from);
  while (_Var2 = hdr_iter_next((hdr_iter *)&dropped), iVar1 = iter.total_count, _Var2) {
    _Var2 = hdr_record_values(h,iter.cumulative_count,iter.total_count);
    if (!_Var2) {
      value = iVar1 + value;
    }
  }
  return value;
}

Assistant:

int64_t hdr_add(struct hdr_histogram* h, const struct hdr_histogram* from)
{
    struct hdr_iter iter;
    int64_t dropped = 0;
    hdr_iter_recorded_init(&iter, from);

    while (hdr_iter_next(&iter))
    {
        int64_t value = iter.value;
        int64_t count = iter.count;

        if (!hdr_record_values(h, value, count))
        {
            dropped += count;
        }
    }

    return dropped;
}